

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_token_tree.cpp
# Opt level: O0

void __thiscall duckdb::WindowTokenTreeLocalState::BuildLeaves(WindowTokenTreeLocalState *this)

{
  data_ptr_t pdVar1;
  ulong uVar2;
  element_type *peVar3;
  type pGVar4;
  bool bVar5;
  data_ptr_t *r_ptr;
  SortLayout *sort_layout_00;
  idx_t iVar6;
  SBScanState *in_RDI;
  int lt;
  vector<unsigned_char,_true> *deltas;
  value_type block_end;
  value_type block_begin;
  SortLayout *sort_layout;
  SBIterator prev;
  SBIterator curr;
  GlobalSortState *global_sort;
  reference in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  value_type in_stack_fffffffffffffd97;
  mutex *in_stack_fffffffffffffd98;
  SBIterator *in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  undefined8 in_stack_fffffffffffffdb0;
  ExpressionType comparison;
  GlobalSortState *in_stack_fffffffffffffdb8;
  SBIterator *in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 uVar7;
  SBScanState *right;
  int local_214;
  SBIterator local_f8;
  type local_10;
  
  comparison = (ExpressionType)((ulong)in_stack_fffffffffffffdb0 >> 0x38);
  local_10 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
             ::operator*((unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
                          *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  bVar5 = ::std::
          vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
                   *)in_stack_fffffffffffffda0);
  if (!bVar5) {
    right = (SBScanState *)0x0;
    uVar7 = 0x1b;
    SBIterator::SBIterator
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,comparison,
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    SBIterator::SBIterator
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,comparison,
               CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    pGVar4 = local_10;
    r_ptr = (data_ptr_t *)
            ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                       CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                       (size_type)in_stack_fffffffffffffd88);
    pdVar1 = *r_ptr;
    sort_layout_00 =
         (SortLayout *)
         ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                    (size_type)in_stack_fffffffffffffd88);
    uVar2 = sort_layout_00->column_count;
    peVar3 = in_RDI[1].blob_sorting_data_handle.handle.internal.
             super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pdVar1 == (data_ptr_t)0x0) {
      in_stack_fffffffffffffdb8 =
           (GlobalSortState *)
           vector<unsigned_char,_true>::operator[]
                     ((vector<unsigned_char,_true> *)
                      CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                      (size_type)in_stack_fffffffffffffd88);
      *(value_type *)&in_stack_fffffffffffffdb8->context = '\0';
    }
    else {
      SBIterator::SetIndex(in_stack_fffffffffffffda0,(idx_t)in_stack_fffffffffffffd98);
      SBIterator::SetIndex(in_stack_fffffffffffffda0,(idx_t)in_stack_fffffffffffffd98);
    }
    SBIterator::operator++
              ((SBIterator *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    while (iVar6 = SBIterator::GetIndex(&local_f8), iVar6 < uVar2) {
      if (((pGVar4->sort_layout).all_constant & 1U) == 0) {
        local_214 = Comparators::CompareTuple
                              (in_RDI,right,(data_ptr_t *)CONCAT44(uVar7,in_stack_fffffffffffffdd0),
                               r_ptr,sort_layout_00,(bool *)in_stack_fffffffffffffdb8);
      }
      else {
        local_214 = FastMemcmp(in_stack_fffffffffffffd98,
                               (void *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90)
                               ,(size_t)in_stack_fffffffffffffd88);
      }
      in_stack_fffffffffffffd97 = local_214 != 0;
      in_stack_fffffffffffffd98 = &peVar3[1].lock;
      SBIterator::GetIndex(&local_f8);
      in_stack_fffffffffffffd88 =
           vector<unsigned_char,_true>::operator[]
                     ((vector<unsigned_char,_true> *)
                      CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                      (size_type)in_stack_fffffffffffffd88);
      *in_stack_fffffffffffffd88 = in_stack_fffffffffffffd97;
      SBIterator::operator++
                ((SBIterator *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
      SBIterator::operator++
                ((SBIterator *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
    }
    SBIterator::~SBIterator((SBIterator *)0x1a45ec0);
    SBIterator::~SBIterator((SBIterator *)0x1a45ecd);
  }
  return;
}

Assistant:

void WindowTokenTreeLocalState::BuildLeaves() {
	auto &global_sort = *token_tree.global_sort;
	if (global_sort.sorted_blocks.empty()) {
		return;
	}

	//	Scan the sort keys and note deltas
	SBIterator curr(global_sort, ExpressionType::COMPARE_LESSTHAN);
	SBIterator prev(global_sort, ExpressionType::COMPARE_LESSTHAN);
	const auto &sort_layout = global_sort.sort_layout;

	const auto block_begin = token_tree.block_starts.at(build_task);
	const auto block_end = token_tree.block_starts.at(build_task + 1);
	auto &deltas = token_tree.deltas;
	if (!block_begin) {
		// First block, so set up initial delta
		deltas[0] = 0;
	} else {
		// Move to the to end of the previous block
		// so we can record the comparison result for the first row
		curr.SetIndex(block_begin - 1);
		prev.SetIndex(block_begin - 1);
	}

	for (++curr; curr.GetIndex() < block_end; ++curr, ++prev) {
		int lt = 0;
		if (sort_layout.all_constant) {
			lt = FastMemcmp(prev.entry_ptr, curr.entry_ptr, sort_layout.comparison_size);
		} else {
			lt = Comparators::CompareTuple(prev.scan, curr.scan, prev.entry_ptr, curr.entry_ptr, sort_layout,
			                               prev.external);
		}

		deltas[curr.GetIndex()] = (lt != 0);
	}
}